

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O1

void __thiscall xmrig::SelfSelectClient::tick(SelfSelectClient *this,uint64_t now)

{
  long lVar1;
  
  (*this->m_client->_vptr_IClient[0x19])();
  if (this->m_state == RetryState) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    if (this->m_retryPause <= lVar1 / 1000000 - this->m_timestamp) {
      getBlockTemplate(this);
      return;
    }
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::tick(uint64_t now)
{
    m_client->tick(now);

    if (m_state == RetryState) {
        if (Chrono::steadyMSecs() - m_timestamp < m_retryPause) {
            return;
        }

        getBlockTemplate();
    }
}